

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

http_settings_s * http_settings_new(http_settings_s arg_settings)

{
  code *pcVar1;
  http_settings_s *phVar2;
  size_t sVar3;
  char *__s;
  size_t __n;
  char *__s_00;
  char *pcVar4;
  long lVar5;
  undefined8 *puVar6;
  http_settings_s *phVar7;
  char *home;
  code *pcVar8;
  byte bVar9;
  code *in_stack_00000008;
  code *in_stack_00000010;
  code *in_stack_00000018;
  void *in_stack_00000030;
  
  bVar9 = 0;
  if (in_stack_00000008 == (code *)0x0) {
    in_stack_00000008 = http_on_request_fallback;
  }
  if (in_stack_00000018 == (code *)0x0) {
    in_stack_00000018 = http_on_response_fallback;
  }
  if (in_stack_00000010 == (code *)0x0) {
    in_stack_00000010 = http_on_upgrade_fallback;
  }
  if (arg_settings.on_upgrade == (_func_void_http_s_ptr_char_ptr_size_t *)0x0) {
    arg_settings.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)0x3200000;
  }
  if ((char)arg_settings.max_body_size == '\0') {
    arg_settings.max_body_size._0_1_ = '(';
  }
  if (arg_settings.max_header_size == 0) {
    arg_settings.max_header_size = 0x40000;
  }
  if (arg_settings.max_body_size._1_1_ == '\0') {
    arg_settings.max_body_size._1_1_ = '(';
  }
  if (arg_settings.on_request == (_func_void_http_s_ptr *)0x0) {
    arg_settings.on_request = (_func_void_http_s_ptr *)0x8000;
  }
  if ((((long)arg_settings.on_response < 1) ||
      (pcVar8 = arg_settings.on_response + 0x40, pcVar1 = (code *)fio_capa(), pcVar1 < pcVar8)) &&
     (arg_settings.on_response = (_func_void_http_s_ptr *)fio_capa(),
     0x40 < (long)arg_settings.on_response)) {
    arg_settings.on_response = arg_settings.on_response + -0x40;
  }
  phVar2 = (http_settings_s *)malloc(0x88);
  puVar6 = &stack0x00000008;
  phVar7 = phVar2;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    phVar7->on_request = (_func_void_http_s_ptr *)*puVar6;
    puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
    phVar7 = (http_settings_s *)((long)phVar7 + (ulong)bVar9 * -0x10 + 8);
  }
  pcVar4 = phVar2->public_folder;
  if (pcVar4 != (char *)0x0) {
    sVar3 = strlen(pcVar4);
    phVar2->public_folder_length = sVar3;
    if (((*pcVar4 == '~') && (pcVar4[1] == '/')) && (__s = getenv("HOME"), __s != (char *)0x0)) {
      __n = strlen(__s);
      __s_00 = (char *)malloc(sVar3 + __n + 1);
      memcpy(__s_00,__s,__n);
      memcpy(__s_00 + (__n - (__s[__n - 1] == '/')),pcVar4 + 1,sVar3);
      phVar2->public_folder = __s_00;
      sVar3 = strlen(__s_00);
      phVar2->public_folder_length = sVar3;
      return phVar2;
    }
    pcVar4 = (char *)malloc(sVar3 + 1);
    phVar2->public_folder = pcVar4;
    memcpy(pcVar4,in_stack_00000030,sVar3);
    pcVar4[sVar3] = '\0';
  }
  return phVar2;
}

Assistant:

static http_settings_s *http_settings_new(http_settings_s arg_settings) {
  /* TODO: improve locality by unifying malloc to a single call */
  if (!arg_settings.on_request)
    arg_settings.on_request = http_on_request_fallback;
  if (!arg_settings.on_response)
    arg_settings.on_response = http_on_response_fallback;
  if (!arg_settings.on_upgrade)
    arg_settings.on_upgrade = http_on_upgrade_fallback;

  if (!arg_settings.max_body_size)
    arg_settings.max_body_size = HTTP_DEFAULT_BODY_LIMIT;
  if (!arg_settings.timeout)
    arg_settings.timeout = 40;
  if (!arg_settings.ws_max_msg_size)
    arg_settings.ws_max_msg_size = 262144; /** defaults to ~250KB */
  if (!arg_settings.ws_timeout)
    arg_settings.ws_timeout = 40; /* defaults to 40 seconds */
  if (!arg_settings.max_header_size)
    arg_settings.max_header_size = 32 * 1024; /* defaults to 32Kib seconds */
  if (arg_settings.max_clients <= 0 ||
      (size_t)(arg_settings.max_clients + HTTP_BUSY_UNLESS_HAS_FDS) >
          fio_capa()) {
    arg_settings.max_clients = fio_capa();
    if ((ssize_t)arg_settings.max_clients - HTTP_BUSY_UNLESS_HAS_FDS > 0)
      arg_settings.max_clients -= HTTP_BUSY_UNLESS_HAS_FDS;
  }

  http_settings_s *settings = malloc(sizeof(*settings) + sizeof(void *));
  *settings = arg_settings;

  if (settings->public_folder) {
    settings->public_folder_length = strlen(settings->public_folder);
    if (settings->public_folder[0] == '~' &&
        settings->public_folder[1] == '/' && getenv("HOME")) {
      char *home = getenv("HOME");
      size_t home_len = strlen(home);
      char *tmp = malloc(settings->public_folder_length + home_len + 1);
      memcpy(tmp, home, home_len);
      if (home[home_len - 1] == '/')
        --home_len;
      memcpy(tmp + home_len, settings->public_folder + 1,
             settings->public_folder_length); // copy also the NULL
      settings->public_folder = tmp;
      settings->public_folder_length = strlen(settings->public_folder);
    } else {
      settings->public_folder = malloc(settings->public_folder_length + 1);
      memcpy((void *)settings->public_folder, arg_settings.public_folder,
             settings->public_folder_length);
      ((uint8_t *)settings->public_folder)[settings->public_folder_length] = 0;
    }
  }
  return settings;
}